

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void uv_pipe_connect(uv_connect_t *req,uv_pipe_t *handle,char *name,uv_connect_cb cb)

{
  int iVar1;
  size_t namelen;
  int err;
  uv_connect_cb cb_local;
  char *name_local;
  uv_pipe_t *handle_local;
  uv_connect_t *req_local;
  
  namelen = strlen(name);
  iVar1 = uv_pipe_connect2(req,handle,name,namelen,0,cb);
  if (iVar1 != 0) {
    handle->delayed_error = iVar1;
    handle->connect_req = req;
    req->loop = handle->loop;
    req->type = UV_CONNECT;
    (handle->loop->active_reqs).count = (handle->loop->active_reqs).count + 1;
    req->handle = (uv_stream_t *)handle;
    req->cb = cb;
    uv__queue_init(&req->queue);
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return;
}

Assistant:

void uv_pipe_connect(uv_connect_t* req,
                    uv_pipe_t* handle,
                    const char* name,
                    uv_connect_cb cb) {
  int err;

  err = uv_pipe_connect2(req, handle, name, strlen(name), 0, cb);

  if (err) {
    handle->delayed_error = err;
    handle->connect_req = req;

    uv__req_init(handle->loop, req, UV_CONNECT);
    req->handle = (uv_stream_t*) handle;
    req->cb = cb;
    uv__queue_init(&req->queue);

    /* Force callback to run on next tick in case of error. */
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}